

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O3

int TAP_SaveEmpty(path *fname)

{
  pointer pcVar1;
  int iVar2;
  FILE *__stream;
  long *local_30 [2];
  long local_20 [2];
  
  __stream = (FILE *)SJ_fopen(fname,"wb");
  if (__stream == (FILE *)0x0) {
    pcVar1 = (fname->_M_pathname)._M_dataplus._M_p;
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_30,pcVar1,pcVar1 + (fname->_M_pathname)._M_string_length);
    Error("opening file for write",(char *)local_30[0],PASS3);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
    iVar2 = 0;
  }
  else {
    fclose(__stream);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int TAP_SaveEmpty(const std::filesystem::path & fname) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) {
		Error("opening file for write", fname.string().c_str()); return 0;
	}
	fclose(ff);
	return 1;
}